

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O0

void __thiscall QHstsStore::QHstsStore(QHstsStore *this,QString *dirName)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *dirName_00;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dirName_00 = in_RDI;
  QList<QHstsPolicy>::QList((QList<QHstsPolicy> *)0x28be2f);
  absoluteFilePath(dirName_00);
  QSettings::QSettings((QSettings *)(in_RDI + 1),(QString *)local_20,IniFormat,(QObject *)0x0);
  QString::~QString((QString *)0x28be77);
  QSettings::setFallbacksEnabled(SUB81((QSettings *)(in_RDI + 1),0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHstsStore::QHstsStore(const QString &dirName)
    : store(absoluteFilePath(dirName), QSettings::IniFormat)
{
    // Disable fallbacks, we do not want to use anything but our own ini file.
    store.setFallbacksEnabled(false);
}